

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O0

void report_local_unit_type_error(Dwarf_Debug dbg,int unit_type,char *msg,Dwarf_Error *error)

{
  undefined8 error_00;
  char *msg_00;
  undefined1 local_48 [8];
  dwarfstring m;
  Dwarf_Error *error_local;
  char *msg_local;
  int unit_type_local;
  Dwarf_Debug dbg_local;
  
  if (error != (Dwarf_Error *)0x0) {
    m._24_8_ = error;
    dwarfstring_constructor((dwarfstring_s *)local_48);
    dwarfstring_append_printf_s((dwarfstring *)local_48,"DW_DLE_CU_UT_TYPE_VALUE: %s ",msg);
    dwarfstring_append_printf_u
              ((dwarfstring *)local_48,
               "the compilation unit unit_type is 0x%x, which is unknown to libdwarf. Corrupt DWARF."
               ,(long)unit_type);
    error_00 = m._24_8_;
    msg_00 = dwarfstring_string((dwarfstring_s *)local_48);
    _dwarf_error_string(dbg,(Dwarf_Error *)error_00,0x1c6,msg_00);
    dwarfstring_destructor((dwarfstring_s *)local_48);
  }
  return;
}

Assistant:

static void
report_local_unit_type_error(Dwarf_Debug dbg,
    int unit_type,
    const char *msg,
    Dwarf_Error *error)
{
    dwarfstring m;

    if (!error) {
        return;
    }
    dwarfstring_constructor(&m);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_CU_UT_TYPE_VALUE: %s ",(char *)msg);
    dwarfstring_append_printf_u(&m,
        "the compilation unit unit_type is 0x%x,"
        " which is unknown to libdwarf. Corrupt DWARF.",
        unit_type);
    _dwarf_error_string(dbg,error,DW_DLE_CU_UT_TYPE_VALUE,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}